

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::~basic_bson_cursor
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,void **vtt)

{
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_RSI;
  basic_staj_cursor<char> *in_RDI;
  
  in_RDI->_vptr_basic_staj_cursor = (in_RSI->super_ser_context)._vptr_ser_context;
  *(undefined8 *)(in_RDI->_vptr_basic_staj_cursor[-3] + (long)&in_RDI->_vptr_basic_staj_cursor) =
       *(undefined8 *)&in_RSI->more_;
  basic_staj_visitor<char>::~basic_staj_visitor((basic_staj_visitor<char> *)0x1f1a8d);
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::~basic_bson_parser(in_RSI);
  basic_staj_cursor<char>::~basic_staj_cursor(in_RDI);
  return;
}

Assistant:

~basic_bson_cursor() = default;